

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::CurrentSchemasBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  Expression *pEVar1;
  LogicalTypeId LVar2;
  bool bVar3;
  pointer pEVar4;
  BinderException *this;
  ulong uVar5;
  NotImplementedException *this_00;
  type pEVar6;
  pointer this_01;
  Expression *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  vector<duckdb::CatalogSearchEntry,_true> *search_path;
  unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
  *catalog_search_path;
  vector<duckdb::Value,_true> schema_list;
  bool implicit_schemas;
  Value result_val;
  Value schema_value;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
  *in_stack_fffffffffffffd18;
  back_insert_iterator<duckdb::vector<duckdb::Value,_true>_> in_stack_fffffffffffffd20;
  vector<duckdb::CatalogSearchEntry,_true> *local_2c0;
  Value *in_stack_fffffffffffffd88;
  undefined1 local_250 [24];
  LogicalType local_238 [24];
  Value local_220 [64];
  vector<duckdb::Value,_true> *local_1e0;
  vector<duckdb::Value,_true> *local_1d0;
  CatalogSearchEntry *local_1c8;
  CatalogSearchEntry *local_1c0;
  vector<duckdb::CatalogSearchEntry,_true> *local_1b8;
  long local_1b0;
  byte local_189;
  LogicalType local_188 [24];
  LogicalType local_170 [24];
  Value local_158 [64];
  LogicalType local_118 [24];
  Value local_100 [64];
  ClientContext local_c0 [70];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [48];
  Expression *local_10;
  
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd20.container,(size_type)in_stack_fffffffffffffd18);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd20.container);
  LVar2 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
  if (LVar2 != BOOLEAN) {
    local_55 = 1;
    this = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"current_schemas requires a boolean input",&local_41);
    duckdb::BinderException::BinderException(this,local_40);
    local_55 = 0;
    __cxa_throw(this,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd20.container,(size_type)in_stack_fffffffffffffd18);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd20.container);
  uVar5 = (**(code **)(*(long *)pEVar4 + 0x78))();
  pEVar1 = local_10;
  if ((uVar5 & 1) == 0) {
    local_7a = 1;
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"current_schemas requires a constant input",&local_79);
    duckdb::NotImplementedException::NotImplementedException(this_00,local_78);
    local_7a = 0;
    __cxa_throw(this_00,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd20.container,(size_type)in_stack_fffffffffffffd18);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd20.container);
  duckdb::ExpressionExecutor::EvaluateScalar(local_c0,pEVar1,SUB81(pEVar6,0));
  duckdb::LogicalType::LogicalType(local_118,SQLNULL);
  duckdb::Value::Value(local_100,local_118);
  duckdb::LogicalType::~LogicalType(local_118);
  bVar3 = Value::IsNull((Value *)local_c0);
  if (bVar3) {
    duckdb::LogicalType::LogicalType(local_188,VARCHAR);
    duckdb::LogicalType::LIST(local_170);
    duckdb::Value::Value(local_158,local_170);
    duckdb::Value::operator=(local_100,local_158);
    duckdb::Value::~Value(local_158);
    duckdb::LogicalType::~LogicalType(local_170);
    duckdb::LogicalType::~LogicalType(local_188);
  }
  else {
    local_189 = duckdb::BooleanValue::Get((Value *)local_c0);
    local_189 = local_189 & 1;
    vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0xd33bfb);
    local_1b0 = duckdb::ClientData::Get((ClientContext *)local_10);
    local_1b0 = local_1b0 + 0x78;
    if ((local_189 & 1) == 0) {
      this_01 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                ::operator->((unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                              *)in_stack_fffffffffffffd20.container);
      local_2c0 = CatalogSearchPath::GetSetPaths(this_01);
    }
    else {
      unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>::
      operator->((unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                  *)in_stack_fffffffffffffd20.container);
      local_2c0 = (vector<duckdb::CatalogSearchEntry,_true> *)duckdb::CatalogSearchPath::Get();
    }
    local_1b8 = local_2c0;
    local_1c0 = (CatalogSearchEntry *)
                std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                ::begin(in_stack_fffffffffffffd18);
    local_1c8 = (CatalogSearchEntry *)
                std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                ::end(in_stack_fffffffffffffd18);
    local_1d0 = (vector<duckdb::Value,_true> *)
                std::back_inserter<duckdb::vector<duckdb::Value,true>>
                          ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffd18);
    in_stack_fffffffffffffd20 =
         std::
         transform<__gnu_cxx::__normal_iterator<duckdb::CatalogSearchEntry_const*,std::vector<duckdb::CatalogSearchEntry,std::allocator<duckdb::CatalogSearchEntry>>>,std::back_insert_iterator<duckdb::vector<duckdb::Value,true>>,duckdb::CurrentSchemasBind(duckdb::ClientContext&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::__0>
                   (local_1c0,local_1c8,local_1d0);
    local_1e0 = (vector<duckdb::Value,_true> *)in_stack_fffffffffffffd20;
    duckdb::LogicalType::LogicalType(local_238,VARCHAR);
    vector<duckdb::Value,_true>::vector
              (in_stack_fffffffffffffd20.container,
               (vector<duckdb::Value,_true> *)in_stack_fffffffffffffd18);
    duckdb::Value::LIST(local_220,local_238,local_250);
    duckdb::Value::operator=(local_100,local_220);
    duckdb::Value::~Value(local_220);
    vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0xd33d8e);
    duckdb::LogicalType::~LogicalType(local_238);
    vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0xd33da8);
  }
  make_uniq<duckdb::CurrentSchemasBindData,duckdb::Value>(in_stack_fffffffffffffd88);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::CurrentSchemasBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_fffffffffffffd20.container,
             (unique_ptr<duckdb::CurrentSchemasBindData,_std::default_delete<duckdb::CurrentSchemasBindData>_>
              *)in_stack_fffffffffffffd18);
  unique_ptr<duckdb::CurrentSchemasBindData,_std::default_delete<duckdb::CurrentSchemasBindData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::CurrentSchemasBindData,_std::default_delete<duckdb::CurrentSchemasBindData>,_true>
                 *)0xd33e4c);
  duckdb::Value::~Value(local_100);
  duckdb::Value::~Value((Value *)local_c0);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> CurrentSchemasBind(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->return_type.id() != LogicalTypeId::BOOLEAN) {
		throw BinderException("current_schemas requires a boolean input");
	}
	if (!arguments[0]->IsFoldable()) {
		throw NotImplementedException("current_schemas requires a constant input");
	}
	Value schema_value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	Value result_val;
	if (schema_value.IsNull()) {
		// null
		result_val = Value(LogicalType::LIST(LogicalType::VARCHAR));
	} else {
		auto implicit_schemas = BooleanValue::Get(schema_value);
		vector<Value> schema_list;
		auto &catalog_search_path = ClientData::Get(context).catalog_search_path;
		auto &search_path = implicit_schemas ? catalog_search_path->Get() : catalog_search_path->GetSetPaths();
		std::transform(search_path.begin(), search_path.end(), std::back_inserter(schema_list),
		               [](const CatalogSearchEntry &s) -> Value { return Value(s.schema); });
		result_val = Value::LIST(LogicalType::VARCHAR, schema_list);
	}
	return make_uniq<CurrentSchemasBindData>(std::move(result_val));
}